

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleAliases.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  ArrayIterator *sub;
  size_t i;
  uint8_t *puVar2;
  VPackSlice s;
  ArrayIterator local_130;
  uint8_t *local_110;
  ArrayIterator __begin1;
  VPackBuilder b;
  
  arangodb::velocypack::Builder::Builder(&b);
  arangodb::velocypack::Value::Value((Value *)&local_130,Array,false);
  sub = &local_130;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)sub);
  for (puVar2 = (uint8_t *)0x0; puVar2 != (uint8_t *)0xa; puVar2 = puVar2 + 1) {
    local_130._slice._start._0_4_ = CONCAT31(local_130._slice._start._1_3_,0xc);
    local_130._slice._start._4_4_ = 4;
    sub = &local_130;
    local_130._current = puVar2;
    arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&local_130);
  }
  arangodb::velocypack::Builder::close(&b,(int)sub);
  s._start = arangodb::velocypack::Builder::start(&b);
  poVar1 = std::operator<<((ostream *)&std::cout,"Slice: ");
  poVar1 = arangodb::velocypack::operator<<(poVar1,&s);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
  poVar1 = operator<<(poVar1,arangodb::velocypack::SliceStaticData::TypeMap[*s._start]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Bytesize: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
  byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Members: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Iterating Array members:");
  std::endl<char,std::char_traits<char>>(poVar1);
  arangodb::velocypack::ArrayIterator::ArrayIterator(&local_130,(Slice)s._start);
  __begin1._slice._start =
       (uint8_t *)CONCAT44(local_130._slice._start._4_4_,local_130._slice._start._0_4_);
  __begin1._size = local_130._size;
  __begin1._position = local_130._position;
  __begin1._current = local_130._current;
  while (__begin1._position != __begin1._size) {
    local_110 = (uint8_t *)arangodb::velocypack::ArrayIterator::value(&__begin1);
    poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,(Slice *)&local_110);
    poVar1 = std::operator<<(poVar1,", number value: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    getUInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_110);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    arangodb::velocypack::ArrayIterator::next(&__begin1);
  }
  arangodb::velocypack::Builder::~Builder(&b);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an array with 10 number members
  VPackBuilder b;

  b(VPackValue(VPackValueType::Array));
  for (size_t i = 0; i < 10; ++i) {
    b.add(VPackValue(i));
  }
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  VPackSlice s(b.start());

  // inspect the outermost value (should be an Array...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  // now iterate over the array members
  std::cout << "Iterating Array members:" << std::endl;
  for (auto const& it : VPackArrayIterator(s)) {
    std::cout << it << ", number value: " << it.getUInt() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}